

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_copy_from_prespch(fe_t *fe,int32 *inout_nframes,mfcc_t **buf_cep,int outidx)

{
  bool bVar1;
  int iVar2;
  int local_24;
  int outidx_local;
  mfcc_t **buf_cep_local;
  int32 *inout_nframes_local;
  fe_t *fe_local;
  
  local_24 = outidx;
  while( true ) {
    bVar1 = false;
    if (0 < *inout_nframes) {
      iVar2 = fe_prespch_read_cep(fe->vad_data->prespch_buf,buf_cep[local_24]);
      bVar1 = 0 < iVar2;
    }
    if (!bVar1) break;
    local_24 = local_24 + 1;
    *inout_nframes = *inout_nframes + -1;
  }
  return local_24;
}

Assistant:

static int
fe_copy_from_prespch(fe_t *fe, int32 *inout_nframes, mfcc_t **buf_cep, int outidx)
{
    while ((*inout_nframes) > 0 && fe_prespch_read_cep(fe->vad_data->prespch_buf, buf_cep[outidx]) > 0) {
	    outidx++;
    	    (*inout_nframes)--;
    }
    return outidx;    
}